

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.cc
# Opt level: O2

void __thiscall WorkSpace::status(WorkSpace *this)

{
  pointer pJVar1;
  pointer pPVar2;
  pointer pLVar3;
  pointer pLVar4;
  ostream *poVar5;
  int di;
  ulong uVar6;
  JournalOperation *j;
  pointer this_00;
  long lVar7;
  
  pJVar1 = (this->journal).super__Vector_base<JournalOperation,_std::allocator<JournalOperation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->journal).
                 super__Vector_base<JournalOperation,_std::allocator<JournalOperation>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pJVar1; this_00 = this_00 + 1) {
    JournalOperation::status(this_00);
  }
  SequenceDistanceGraph::print_status(&this->sdg);
  lVar7 = 0;
  poVar5 = sdglib::OutputLog(INFO,true);
  poVar5 = std::operator<<(poVar5,"Workspace contains ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," paired reads datastores");
  std::endl<char,std::char_traits<char>>(poVar5);
  for (uVar6 = 0;
      pPVar2 = (this->paired_reads_datastores).
               super__Vector_base<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(this->paired_reads_datastores).
                             super__Vector_base<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x178);
      uVar6 = uVar6 + 1) {
    PairedReadsDatastore::print_status
              ((PairedReadsDatastore *)((long)&(pPVar2->filename)._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + 0x178;
  }
  lVar7 = 0;
  poVar5 = sdglib::OutputLog(INFO,true);
  poVar5 = std::operator<<(poVar5,"Workspace contains ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," linked reads datastores");
  std::endl<char,std::char_traits<char>>(poVar5);
  for (uVar6 = 0;
      pLVar3 = (this->linked_reads_datastores).
               super__Vector_base<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(this->linked_reads_datastores).
                             super__Vector_base<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar3) / 0x138);
      uVar6 = uVar6 + 1) {
    LinkedReadsDatastore::print_status
              ((LinkedReadsDatastore *)((long)&(pLVar3->filename)._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + 0x138;
  }
  lVar7 = 0;
  poVar5 = sdglib::OutputLog(INFO,true);
  poVar5 = std::operator<<(poVar5,"Workspace contains ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," long reads datastores");
  std::endl<char,std::char_traits<char>>(poVar5);
  for (uVar6 = 0;
      pLVar4 = (this->long_reads_datastores).
               super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(this->long_reads_datastores).
                             super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar4) / 0x158);
      uVar6 = uVar6 + 1) {
    LongReadsDatastore::print_status((LongReadsDatastore *)((long)&pLVar4->ws + lVar7));
    lVar7 = lVar7 + 0x158;
  }
  return;
}

Assistant:

void WorkSpace::status() {
    for (const auto &j:journal){
        j.status();
    }
    //graph
    sdg.print_status();

    //PR datastores and mappings
    sdglib::OutputLog()<<"Workspace contains "<< paired_reads_datastores.size() << " paired reads datastores" <<std::endl;
    for (auto di=0;di<paired_reads_datastores.size();++di){
        paired_reads_datastores[di].print_status();

    }
    //10x datastores and mappings
    sdglib::OutputLog()<<"Workspace contains "<< linked_reads_datastores.size() << " linked reads datastores" <<std::endl;
    for (auto di=0;di<linked_reads_datastores.size();++di){
        linked_reads_datastores[di].print_status();
    }
    //LR datastores and mappings
    sdglib::OutputLog()<<"Workspace contains "<< long_reads_datastores.size() << " long reads datastores" <<std::endl;
    for (auto di=0;di<long_reads_datastores.size();++di){
        long_reads_datastores[di].print_status();
    }

}